

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLstack.c
# Opt level: O2

void RDL_stack_push(RDL_stack *stack,void *element)

{
  void **__ptr;
  void **ppvVar1;
  void **ppvVar2;
  uint uVar3;
  
  uVar3 = stack->size;
  if (uVar3 == stack->reserved) {
    stack->reserved = uVar3 * 2;
    __ptr = stack->elements;
    ppvVar1 = stack->top;
    ppvVar2 = (void **)realloc(__ptr,(ulong)(uVar3 * 2) << 3);
    stack->elements = ppvVar2;
    ppvVar2 = (void **)(((long)ppvVar1 - (long)__ptr & 0x7fffffff8U) + (long)ppvVar2);
    uVar3 = stack->size;
  }
  else {
    ppvVar2 = stack->top;
  }
  stack->top = ppvVar2 + 1;
  stack->size = uVar3 + 1;
  ppvVar2[1] = element;
  return;
}

Assistant:

void RDL_stack_push(RDL_stack* stack, void* element)
{
  unsigned distance;

  if (stack->size == stack->reserved) {
    stack->reserved *= 2;

    distance = stack->top - stack->elements;

    stack->elements = realloc(stack->elements,
        stack->reserved * sizeof(*stack->elements));

    stack->top = stack->elements + distance;
  }
  ++stack->top;
  ++stack->size;
  *stack->top = element;
}